

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guarded_opt.hpp
# Opt level: O0

handle * __thiscall
gmlc::libguarded::guarded_opt<int,_std::timed_mutex>::lock
          (handle *__return_storage_ptr__,guarded_opt<int,_std::timed_mutex> *this)

{
  unique_lock<std::timed_mutex> local_28;
  guarded_opt<int,_std::timed_mutex> *local_18;
  guarded_opt<int,_std::timed_mutex> *this_local;
  
  local_18 = this;
  this_local = (guarded_opt<int,_std::timed_mutex> *)__return_storage_ptr__;
  if ((this->enabled & 1U) == 0) {
    std::unique_lock<std::timed_mutex>::unique_lock(&local_28);
    lock_handle<int,_std::timed_mutex>::lock_handle(__return_storage_ptr__,&this->m_obj,&local_28);
    std::unique_lock<std::timed_mutex>::~unique_lock(&local_28);
  }
  else {
    lock_handle<int,_std::timed_mutex>::lock_handle
              (__return_storage_ptr__,&this->m_obj,&this->m_mutex);
  }
  return __return_storage_ptr__;
}

Assistant:

auto guarded_opt<T, M>::lock() -> handle
{
    return (enabled) ? handle(&m_obj, m_mutex) :
                       handle(&m_obj, std::unique_lock<M>());
}